

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref__data_source_on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint64 mVar1;
  ma_uint64 *in_RCX;
  ulong in_RDX;
  ma_uint64 framesRead;
  ma_audio_buffer_ref *pAudioBufferRef;
  undefined4 local_4;
  
  mVar1 = ma_audio_buffer_ref_read_pcm_frames
                    ((ma_audio_buffer_ref *)pDataSource,pFramesOut,frameCount,pFramesRead._4_4_);
  if (in_RCX != (ma_uint64 *)0x0) {
    *in_RCX = mVar1;
  }
  if ((mVar1 < in_RDX) || (mVar1 == 0)) {
    local_4 = MA_AT_END;
  }
  else {
    local_4 = MA_SUCCESS;
  }
  return local_4;
}

Assistant:

static ma_result ma_audio_buffer_ref__data_source_on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_audio_buffer_ref* pAudioBufferRef = (ma_audio_buffer_ref*)pDataSource;
    ma_uint64 framesRead = ma_audio_buffer_ref_read_pcm_frames(pAudioBufferRef, pFramesOut, frameCount, MA_FALSE);

    if (pFramesRead != NULL) {
        *pFramesRead = framesRead;
    }

    if (framesRead < frameCount || framesRead == 0) {
        return MA_AT_END;
    }

    return MA_SUCCESS;
}